

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

void __thiscall
TEST_MockReturnValueTest_WhenAPointerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenAPointerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  undefined4 extraout_var_00;
  undefined8 uVar4;
  TestTerminator *pTVar5;
  undefined4 extraout_var_01;
  SimpleString local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_20);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x108))
            ((long *)CONCAT44(extraout_var,iVar1),0x144000);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_30);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x148))
                    ((long *)CONCAT44(extraout_var_00,iVar1),0x777);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x13])
            (pUVar3,0x144000,uVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2a6,pTVar5);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_30);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x1c])(pMVar2,0x777);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x13])
            (pUVar3,0x144000,CONCAT44(extraout_var_01,iVar1),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2a7,pTVar5);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenAPointerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    void * default_return_value = (void*) 0x777;
    void * expected_return_value = (void*) 0x144000;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);
    POINTERS_EQUAL(expected_return_value, mock().actualCall("foo").returnPointerValueOrDefault(default_return_value));
    POINTERS_EQUAL(expected_return_value, mock().returnPointerValueOrDefault(default_return_value));
}